

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathBezierCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  int *piVar1;
  float x1;
  float y1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  ImVec2 *pIVar9;
  ImGuiContext *pIVar10;
  long lVar11;
  ImVec2 *__dest;
  int iVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  lVar11 = (long)(this->_Path).Size;
  if (lVar11 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                  ,0x35d,"value_type &ImVector<ImVec2>::back() [T = ImVec2]");
  }
  pIVar9 = (this->_Path).Data;
  x1 = pIVar9[lVar11 + -1].x;
  y1 = pIVar9[lVar11 + -1].y;
  if (num_segments == 0) {
    PathBezierToCasteljau
              (&this->_Path,x1,y1,p2->x,p2->y,p3->x,p3->y,p4->x,p4->y,
               (GImGui->Style).CurveTessellationTol,0);
  }
  else if (0 < num_segments) {
    iVar14 = 1;
    do {
      pIVar10 = GImGui;
      fVar16 = (float)iVar14 * (1.0 / (float)num_segments);
      fVar17 = 1.0 - fVar16;
      fVar19 = fVar17 * fVar17 * 3.0 * fVar16;
      fVar18 = fVar17 * 3.0 * fVar16 * fVar16;
      fVar16 = fVar16 * fVar16 * fVar16;
      fVar2 = p2->x;
      fVar3 = p3->x;
      fVar4 = p4->x;
      fVar5 = p2->y;
      fVar6 = p3->y;
      fVar7 = p4->y;
      iVar13 = (this->_Path).Size;
      iVar8 = (this->_Path).Capacity;
      if (iVar13 == iVar8) {
        if (iVar8 == 0) {
          iVar12 = 8;
        }
        else {
          iVar12 = iVar8 / 2 + iVar8;
        }
        iVar13 = iVar13 + 1;
        if (iVar13 < iVar12) {
          iVar13 = iVar12;
        }
        if (iVar8 < iVar13) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          __dest = (ImVec2 *)(*(pIVar10->IO).MemAllocFn)((long)iVar13 << 3);
          pIVar9 = (this->_Path).Data;
          if (pIVar9 != (ImVec2 *)0x0) {
            memcpy(__dest,pIVar9,(long)(this->_Path).Size << 3);
          }
          pIVar9 = (this->_Path).Data;
          if (pIVar9 != (ImVec2 *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(pIVar9);
          (this->_Path).Data = __dest;
          (this->_Path).Capacity = iVar13;
        }
      }
      fVar17 = fVar17 * fVar17 * fVar17;
      pIVar9 = (this->_Path).Data;
      iVar13 = (this->_Path).Size;
      (this->_Path).Size = iVar13 + 1;
      pIVar9[iVar13].x = fVar4 * fVar16 + fVar3 * fVar18 + fVar17 * x1 + fVar2 * fVar19;
      pIVar9[iVar13].y = fVar16 * fVar7 + fVar18 * fVar6 + fVar17 * y1 + fVar19 * fVar5;
      bVar15 = iVar14 != num_segments;
      iVar14 = iVar14 + 1;
    } while (bVar15);
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        // Auto-tessellated
        PathBezierToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, GImGui->Style.CurveTessellationTol, 0);
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
        {
            float t = t_step * i_step;
            float u = 1.0f - t;
            float w1 = u*u*u;
            float w2 = 3*u*u*t;
            float w3 = 3*u*t*t;
            float w4 = t*t*t;
            _Path.push_back(ImVec2(w1*p1.x + w2*p2.x + w3*p3.x + w4*p4.x, w1*p1.y + w2*p2.y + w3*p3.y + w4*p4.y));
        }
    }
}